

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

Result __thiscall
Controller::generateBoard(Controller *this,BoardSize boardSize,BoardMode boardMode)

{
  bool bVar1;
  Board *this_00;
  pointer this_01;
  pointer this_02;
  BoardMode boardMode_local;
  BoardSize boardSize_local;
  Controller *this_local;
  
  if ((boardMode == GRAPHIC) && (bVar1 = isGraphic(this,boardSize), !bVar1)) {
    return CREATE_GRAPHIC_BOARD_NO_GRAPHIC;
  }
  this_00 = (Board *)operator_new(0x38);
  Board::Board(this_00,boardSize,boardMode);
  std::unique_ptr<Board,_std::default_delete<Board>_>::reset(&this->board,this_00);
  this_01 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
  Board::generateBoard(this_01);
  this_02 = std::unique_ptr<UndoMove,_std::default_delete<UndoMove>_>::operator->
                      (&this->undoMoveService);
  UndoMove::Reset(this_02);
  return OK;
}

Assistant:

Result Controller::generateBoard( BoardSize boardSize, BoardMode boardMode )
{
    if ( boardMode == BoardMode::GRAPHIC && ( isGraphic( boardSize ) == false ))
    {
        return Result::CREATE_GRAPHIC_BOARD_NO_GRAPHIC;
    }
    board.reset( new Board( boardSize, boardMode ));
    board->generateBoard();
    undoMoveService->Reset();
    return Result::OK;
}